

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::LinkedModelFile::clear_linkedmodelsearchpath(LinkedModelFile *this)

{
  ulong uVar1;
  StringParameter *this_00;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_00 = this->linkedmodelsearchpath_, this_00 != (StringParameter *)0x0)) {
    StringParameter::~StringParameter(this_00);
    operator_delete(this_00,0x20);
  }
  this->linkedmodelsearchpath_ = (StringParameter *)0x0;
  return;
}

Assistant:

void LinkedModelFile::clear_linkedmodelsearchpath() {
  if (GetArenaForAllocation() == nullptr && linkedmodelsearchpath_ != nullptr) {
    delete linkedmodelsearchpath_;
  }
  linkedmodelsearchpath_ = nullptr;
}